

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

string * vkt::pipeline::anon_unknown_0::composite_case_internal::
         generateInitializerListWithSpecConstant
                   (string *__return_storage_ptr__,DataType type,bool castToType,int idxBegin,
                   int idxEnd,string *specConstName,int specConstNdx)

{
  DataType DVar1;
  ostream *poVar2;
  char **value;
  char *pcVar3;
  bool local_26b;
  char *local_268;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  byte local_1d6;
  allocator<char> local_1d5 [13];
  undefined1 local_1c8 [8];
  string iVal;
  ostringstream local_1a0 [4];
  int i;
  ostringstream str;
  string *specConstName_local;
  int idxEnd_local;
  int idxBegin_local;
  bool castToType_local;
  DataType type_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  for (iVal.field_2._12_4_ = idxBegin; (int)iVal.field_2._12_4_ < idxEnd;
      iVal.field_2._12_4_ = iVal.field_2._12_4_ + 1) {
    local_1d6 = 0;
    if (iVal.field_2._12_4_ == specConstNdx) {
      std::__cxx11::string::string((string *)local_1c8,(string *)specConstName);
    }
    else {
      DVar1 = glu::getDataTypeScalarType(type);
      if (DVar1 == TYPE_BOOL) {
        std::allocator<char>::allocator();
        local_1d6 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"true",local_1d5);
      }
      else {
        local_1dc = iVal.field_2._12_4_ + 1;
        de::toString<int>((string *)local_1c8,&local_1dc);
      }
    }
    if ((local_1d6 & 1) != 0) {
      std::allocator<char>::~allocator(local_1d5);
    }
    pcVar3 = "";
    if (iVal.field_2._12_4_ != idxBegin) {
      pcVar3 = ", ";
    }
    poVar2 = std::operator<<((ostream *)local_1a0,pcVar3);
    if (!castToType) {
      std::__cxx11::string::string((string *)&local_200,(string *)local_1c8);
    }
    else {
      local_268 = glu::getDataTypeName(type);
      de::toString<char_const*>(&local_260,(de *)&local_268,value);
      std::operator+(&local_240,&local_260,"(");
      std::operator+(&local_220,&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
      ;
      std::operator+(&local_200,&local_220,")");
    }
    local_26b = castToType;
    std::operator<<(poVar2,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    if (local_26b) {
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
    }
    std::__cxx11::string::~string((string *)local_1c8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string generateInitializerListWithSpecConstant (const glu::DataType	type,
													 const bool				castToType,
													 const int				idxBegin,
													 const int				idxEnd,
													 const std::string&		specConstName,
													 const int				specConstNdx)
{
	std::ostringstream str;

	for (int i = idxBegin; i < idxEnd; ++i)
	{
		const std::string iVal = (i == specConstNdx ? specConstName : glu::getDataTypeScalarType(type) == glu::TYPE_BOOL ? "true" : de::toString(i + 1));
		str << (i != idxBegin ? ", " : "") << (castToType ? de::toString(glu::getDataTypeName(type)) + "(" + iVal + ")" : iVal);
	}

	return str.str();
}